

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessmanager.cpp
# Opt level: O0

void __thiscall
QNetworkAccessManager::setCookieJar(QNetworkAccessManager *this,QNetworkCookieJar *cookieJar)

{
  QNetworkAccessManagerPrivate *pQVar1;
  QObject *pQVar2;
  long lVar3;
  long lVar4;
  QNetworkCookieJar *in_RSI;
  QObject *in_RDI;
  QNetworkAccessManagerPrivate *d;
  
  pQVar1 = d_func((QNetworkAccessManager *)0x19b7f1);
  pQVar1->cookieJarCreated = true;
  if (pQVar1->cookieJar != in_RSI) {
    if (((pQVar1->cookieJar != (QNetworkCookieJar *)0x0) &&
        (pQVar2 = QObject::parent((QObject *)0x19b839), pQVar2 == in_RDI)) &&
       (pQVar1->cookieJar != (QNetworkCookieJar *)0x0)) {
      (**(code **)(*(long *)pQVar1->cookieJar + 0x20))();
    }
    pQVar1->cookieJar = in_RSI;
    if (in_RSI != (QNetworkCookieJar *)0x0) {
      lVar3 = QObject::thread();
      lVar4 = QObject::thread();
      if (lVar3 == lVar4) {
        QObject::setParent(&pQVar1->cookieJar->super_QObject);
      }
    }
  }
  return;
}

Assistant:

void QNetworkAccessManager::setCookieJar(QNetworkCookieJar *cookieJar)
{
    Q_D(QNetworkAccessManager);
    d->cookieJarCreated = true;
    if (d->cookieJar != cookieJar) {
        if (d->cookieJar && d->cookieJar->parent() == this)
            delete d->cookieJar;
        d->cookieJar = cookieJar;
        if (cookieJar && thread() == cookieJar->thread())
            d->cookieJar->setParent(this);
    }
}